

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

INTBOOL CheckActorFlag(AActor *owner,char *flagname,bool printerror)

{
  FString type;
  char *pcVar1;
  char *part1_00;
  FString local_48;
  FString part1;
  PClass *cls;
  FFlagDef *fd;
  char *dot;
  bool printerror_local;
  char *flagname_local;
  AActor *owner_local;
  
  pcVar1 = strchr(flagname,0x2e);
  part1.Chars = (char *)AActor::GetClass(owner);
  if (pcVar1 == (char *)0x0) {
    cls = (PClass *)FindFlag((PClass *)part1.Chars,flagname,(char *)0x0);
  }
  else {
    FString::FString(&local_48,flagname,(long)pcVar1 - (long)flagname);
    type.Chars = part1.Chars;
    part1_00 = FString::operator_cast_to_char_(&local_48);
    cls = (PClass *)FindFlag((PClass *)type.Chars,part1_00,pcVar1 + 1);
    FString::~FString(&local_48);
  }
  if (cls == (PClass *)0x0) {
    if (printerror) {
      pcVar1 = FName::GetChars((FName *)(part1.Chars + 0x88));
      Printf("Unknown flag \'%s\' in \'%s\'\n",flagname,pcVar1);
    }
    owner_local._4_4_ = 0;
  }
  else {
    owner_local._4_4_ = CheckActorFlag(owner,(FFlagDef *)cls);
  }
  return owner_local._4_4_;
}

Assistant:

INTBOOL CheckActorFlag(const AActor *owner, const char *flagname, bool printerror)
{
	const char *dot = strchr (flagname, '.');
	FFlagDef *fd;
	const PClass *cls = owner->GetClass();

	if (dot != NULL)
	{
		FString part1(flagname, dot-flagname);
		fd = FindFlag (cls, part1, dot+1);
	}
	else
	{
		fd = FindFlag (cls, flagname, NULL);
	}

	if (fd != NULL)
	{
		return CheckActorFlag(owner, fd);
	}
	else
	{
		if (printerror) Printf("Unknown flag '%s' in '%s'\n", flagname, cls->TypeName.GetChars());
		return false;
	}
}